

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O1

void fft(float *in,int N,float *out)

{
  float *in_00;
  int iVar1;
  long lVar2;
  uint N_00;
  ulong uVar3;
  int iVar4;
  long lVar5;
  int n;
  ulong uVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  if (N == 1) {
    *out = *in;
    out[1] = 0.0;
  }
  else if (N % 2 == 1) {
    iVar1 = 0;
    if (0 < N) {
      uVar3 = 0;
      do {
        fVar9 = 0.0;
        fVar10 = 0.0;
        iVar4 = 0;
        uVar6 = 0;
        do {
          fVar9 = fVar9 + (float)(&DAT_00170490)[iVar4 % 400] * in[uVar6];
          fVar10 = fVar10 + (float)(&(anonymous_namespace)::global_cache)[iVar4 % 400] * -in[uVar6];
          uVar6 = uVar6 + 1;
          iVar4 = iVar4 + iVar1;
        } while ((uint)N != uVar6);
        *(ulong *)(out + uVar3 * 2) = CONCAT44(fVar10,fVar9);
        uVar3 = uVar3 + 1;
        iVar1 = iVar1 + (int)(400 / (long)N);
      } while (uVar3 != (uint)N);
    }
  }
  else {
    N_00 = N / 2;
    in_00 = in + N;
    if (1 < N) {
      uVar3 = 0;
      do {
        in_00[uVar3] = in[uVar3 * 2];
        uVar3 = uVar3 + 1;
      } while (N_00 != uVar3);
    }
    lVar8 = (long)(N * 2);
    fft(in_00,N_00,out + lVar8);
    if (1 < N) {
      uVar3 = 0;
      do {
        in[(long)N + uVar3] = in[uVar3 * 2 + 1];
        uVar3 = uVar3 + 1;
      } while (N_00 != uVar3);
    }
    fft(in_00,N_00,out + lVar8 + N);
    if (1 < N) {
      lVar2 = 0;
      lVar5 = 0;
      do {
        lVar7 = lVar5 * (400 / (ulong)(uint)N);
        fVar9 = (float)(&(anonymous_namespace)::global_cache)[lVar7];
        fVar10 = (float)*(undefined8 *)(out + lVar8 + N);
        fVar14 = (float)(&DAT_00170490)[lVar7] * fVar10;
        fVar11 = (float)((ulong)*(undefined8 *)(out + lVar8 + N) >> 0x20);
        fVar15 = (float)(&DAT_00170490)[lVar7] * fVar11;
        fVar12 = (float)*(undefined8 *)(out + lVar8);
        fVar13 = (float)((ulong)*(undefined8 *)(out + lVar8) >> 0x20);
        *(ulong *)out = CONCAT44(-fVar9 * fVar10 + fVar15 + fVar13,fVar9 * fVar11 + fVar14 + fVar12)
        ;
        *(ulong *)(out + (ulong)N_00 * 2) =
             CONCAT44(fVar9 * fVar10 + (fVar13 - fVar15),-fVar9 * fVar11 + (fVar12 - fVar14));
        lVar5 = lVar5 + 1;
        out = out + 2;
        lVar2 = lVar2 + 8;
      } while ((ulong)N_00 * 8 != lVar2);
    }
  }
  return;
}

Assistant:

static void fft(float* in, int N, float* out) {
    if (N == 1) {
        out[0] = in[0];
        out[1] = 0;
        return;
    }

    const int half_N = N / 2;
    if (N - half_N*2 == 1) {
        dft(in, N, out);
        return;
    }

    float* even = in + N;
    for (int i = 0; i < half_N; ++i) {
        even[i]= in[2*i];
    }
    float* even_fft = out + 2 * N;
    fft(even, half_N, even_fft);

    float* odd = even;
    for (int i = 0; i < half_N; ++i) {
        odd[i] = in[2*i + 1];
    }
    float* odd_fft = even_fft + N;
    fft(odd, half_N, odd_fft);

    const int sin_cos_step = SIN_COS_N_COUNT / N;
    for (int k = 0; k < half_N; k++) {
        int idx = k * sin_cos_step; // t = 2*M_PI*k/N
        float re = global_cache.cos_vals[idx]; // cos(t)
        float im = -global_cache.sin_vals[idx]; // sin(t)

        float re_odd = odd_fft[2*k + 0];
        float im_odd = odd_fft[2*k + 1];

        out[2*k + 0] = even_fft[2*k + 0] + re*re_odd - im*im_odd;
        out[2*k + 1] = even_fft[2*k + 1] + re*im_odd + im*re_odd;

        out[2*(k + half_N) + 0] = even_fft[2*k + 0] - re*re_odd + im*im_odd;
        out[2*(k + half_N) + 1] = even_fft[2*k + 1] - re*im_odd - im*re_odd;
    }
}